

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O0

size_t fiobj_ary_each1(FIOBJ o,size_t start_at,_func_int_FIOBJ_void_ptr *task,void *arg)

{
  size_t sVar1;
  void *arg_local;
  _func_int_FIOBJ_void_ptr *task_local;
  size_t start_at_local;
  FIOBJ o_local;
  
  sVar1 = fio_ary___each((fio_ary___s *)(o + 8),start_at,task,arg);
  return sVar1;
}

Assistant:

static size_t fiobj_ary_each1(FIOBJ o, size_t start_at,
                              int (*task)(FIOBJ obj, void *arg), void *arg) {
  return fio_ary___each(&obj2ary(o)->ary, start_at, task, arg);
}